

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_freeAttributes__naturalnumbers
          (ColladaParserAutoGen15Private *this,void *attributeData)

{
  StackMemoryManager *in_RSI;
  naturalnumbers__AttributeData *in_RDI;
  naturalnumbers__AttributeData *typedAttributeData;
  StackMemoryManager *this_00;
  
  this_00 = in_RSI;
  if (in_RSI[0xf].mFrames != (StackFrame *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(in_RSI);
  }
  if (in_RSI[0x20].mFrames != (StackFrame *)0x0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(this_00);
  }
  naturalnumbers__AttributeData::~naturalnumbers__AttributeData(in_RDI);
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_freeAttributes__naturalnumbers( void* attributeData )
{
    naturalnumbers__AttributeData* typedAttributeData = static_cast<naturalnumbers__AttributeData*>(attributeData);
    if (typedAttributeData->_class.data)
    {
        mStackMemoryManager.deleteObject();
    }

    if (typedAttributeData->unknownAttributes.data)
    {
        mStackMemoryManager.deleteObject();
    }


    typedAttributeData->~naturalnumbers__AttributeData();

    return true;
}